

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file_dictionary_handler.c
# Opt level: O3

ion_cursor_status_t ffdict_next(ion_dict_cursor_t *cursor,ion_record_t *record)

{
  char cVar1;
  ion_flat_file_t *flat_file;
  byte bVar2;
  ion_err_t iVar3;
  ion_fpos_t start_location;
  code *predicate;
  ion_flat_file_row_t row;
  ion_flat_file_row_t local_30;
  
  bVar2 = cursor->status;
  if (3 < bVar2 - 1) {
    return '\0';
  }
  flat_file = (ion_flat_file_t *)cursor->dictionary->instance;
  switch((uint)bVar2) {
  default:
    break;
  case 2:
    cursor->status = '\x04';
LAB_00108e31:
    iVar3 = flat_file_read_row(flat_file,*(ion_fpos_t *)(cursor + 1),&local_30);
    bVar2 = 0xff;
    if (iVar3 == '\0') {
      memcpy(record->key,local_30.key,(long)(cursor->dictionary->instance->record).key_size);
      memcpy(record->value,local_30.value,(long)(cursor->dictionary->instance->record).value_size);
      bVar2 = cursor->status;
    }
    break;
  case 4:
    cVar1 = cursor->predicate->type;
    if (cVar1 == '\x02') {
      start_location = *(long *)(cursor + 1) + 1;
      predicate = flat_file_predicate_not_empty;
LAB_00108eeb:
      iVar3 = flat_file_scan(flat_file,start_location,(ion_fpos_t *)(cursor + 1),&local_30,'\x01',
                             predicate);
      if (iVar3 == '\0') goto LAB_00108e31;
      bVar2 = 1;
      if (iVar3 != '\x0e') goto LAB_00108f12;
    }
    else {
      if (cVar1 == '\x01') {
        start_location = *(long *)(cursor + 1) + 1;
        predicate = flat_file_predicate_within_bounds;
        goto LAB_00108eeb;
      }
      if (cVar1 == '\0') {
        start_location = *(long *)(cursor + 1) + 1;
        predicate = flat_file_predicate_key_match;
        goto LAB_00108eeb;
      }
LAB_00108f12:
      bVar2 = 5;
    }
    cursor->status = bVar2;
  }
  return bVar2;
}

Assistant:

ion_cursor_status_t
ffdict_next(
	ion_dict_cursor_t	*cursor,
	ion_record_t		*record
) {
	ion_flat_file_t			*flat_file			= (ion_flat_file_t *) cursor->dictionary->instance;
	ion_flat_file_cursor_t	*flat_file_cursor	= (ion_flat_file_cursor_t *) cursor;

	if (cursor->status == cs_cursor_uninitialized) {
		return cursor->status;
	}
	else if (cursor->status == cs_end_of_results) {
		return cursor->status;
	}
	else if ((cursor->status == cs_cursor_initialized) || (cursor->status == cs_cursor_active)) {
		if (cursor->status == cs_cursor_active) {
			ion_flat_file_row_t throwaway_row;
			ion_err_t			err = err_uninitialized;

			switch (cursor->predicate->type) {
				case predicate_equality: {
					err = flat_file_scan(flat_file, flat_file_cursor->current_location + 1, &flat_file_cursor->current_location, &throwaway_row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, cursor->predicate->statement.equality.equality_value);

					break;
				}

				case predicate_range: {
					err = flat_file_scan(flat_file, flat_file_cursor->current_location + 1, &flat_file_cursor->current_location, &throwaway_row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_within_bounds, cursor->predicate->statement.range.lower_bound, cursor->predicate->statement.range.upper_bound);

					break;
				}

				case predicate_all_records: {
					err = flat_file_scan(flat_file, flat_file_cursor->current_location + 1, &flat_file_cursor->current_location, &throwaway_row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_not_empty);

					break;
				}

				case predicate_predicate: {
					break;
				}
			}

			if (err_file_hit_eof == err) {
				cursor->status = cs_end_of_results;
				return cursor->status;
			}
			else if (err_ok != err) {
				cursor->status = cs_possible_data_inconsistency;
				return cursor->status;
			}
		}
		else {
			/* The status is cs_cursor_initialized */
			cursor->status = cs_cursor_active;
		}

		ion_flat_file_row_t row;
		ion_err_t			err = flat_file_read_row(flat_file, flat_file_cursor->current_location, &row);

		if (err_ok != err) {
			return cs_invalid_index;
		}

		/*Copy both key and value into user provided struct */
		memcpy(record->key, row.key, cursor->dictionary->instance->record.key_size);
		memcpy(record->value, row.value, cursor->dictionary->instance->record.value_size);

		return cursor->status;
	}

	return cs_invalid_cursor;
}